

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O1

C_Type * find_typedef(C_Parser *parser,C_Token *tok)

{
  void *pvVar1;
  C_Scope *pCVar2;
  
  if (tok->kind == TK_IDENT) {
    pCVar2 = (C_Scope *)&parser->scope;
    do {
      pCVar2 = pCVar2->next;
      if (pCVar2 == (C_Scope *)0x0) {
        pvVar1 = (void *)0x0;
        break;
      }
      pvVar1 = hashmap_get2(&pCVar2->vars,tok->loc,tok->len);
    } while (pvVar1 == (void *)0x0);
    if (pvVar1 != (void *)0x0) {
      return *(C_Type **)((long)pvVar1 + 8);
    }
  }
  return (C_Type *)0x0;
}

Assistant:

static C_Type *find_typedef(C_Parser *parser, C_Token *tok) {
  if (tok->kind == TK_IDENT) {
    C_VarScope *sc = find_var(parser, tok);
    if (sc)
      return sc->type_def;
  }
  return NULL;
}